

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O1

void __thiscall Operand::Operand(Operand *this,Type t,string *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  this->type = t;
  this->reg_num = 0;
  paVar1 = &(this->value).field_2;
  (this->value)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (v->_M_dataplus)._M_p;
  paVar2 = &v->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&v->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->value).field_2 + 8) = uVar4;
  }
  else {
    (this->value)._M_dataplus._M_p = pcVar3;
    (this->value).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->value)._M_string_length = v->_M_string_length;
  (v->_M_dataplus)._M_p = (pointer)paVar2;
  v->_M_string_length = 0;
  (v->field_2)._M_local_buf[0] = '\0';
  if (this->type == literal) {
    return;
  }
  __assert_fail("type == Type::literal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zany80[P]x86-to-z80/src/types.h"
                ,0x38,"Operand::Operand(const Type, std::string)");
}

Assistant:

Operand(const Type t, std::string v)
			: type(t)
			, value(std::move(v)) {
		assert(type == Type::literal);
	}